

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::abort(torrent *this)

{
  undefined1 *puVar1;
  _Atomic_word *p_Var2;
  uint uVar3;
  session_interface *psVar4;
  service_type *psVar5;
  _func_int **pp_Var6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  bool in;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  array<link,_aux::session_interface::num_torrent_lists,_torrent_list_index_t> *this_00;
  torrent_list_index_t i;
  ulong uVar11;
  undefined1 local_68 [24];
  element_type *peStack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  int64_t iStack_40;
  session_interface *local_38;
  pointer pppStack_30;
  
  uVar11 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if (((uint)uVar11 >> 0x1a & 1) == 0) {
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar11 | 0x4000000;
    update_want_peers(this);
    in = want_tick(this);
    update_list(this,(torrent_list_index_t)0x1,in);
    update_want_scrape(this);
    update_gauge(this);
    stop_announcing(this);
    psVar4 = (this->super_torrent_hot_members).m_ses;
    (*(psVar4->super_session_logger)._vptr_session_logger[0x1b])(psVar4,this,0xffffffff);
    if ((this->m_peer_class).m_val != 0) {
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x32])();
      peer_class_set::remove_class
                (&this->super_peer_class_set,(peer_class_pool *)CONCAT44(extraout_var,iVar10),
                 (peer_class_t)(this->m_peer_class).m_val);
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x32])();
      peer_class_pool::decref
                ((peer_class_pool *)CONCAT44(extraout_var_00,iVar10),
                 (peer_class_t)(this->m_peer_class).m_val);
      (this->m_peer_class).m_val = 0;
    }
    if ((this->m_inactivity_timer).impl_.implementation_.might_have_pending_waits == true) {
      psVar5 = (this->m_inactivity_timer).impl_.service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar5->scheduler_,&psVar5->timer_queue_,
                 &(this->m_inactivity_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
      (this->m_inactivity_timer).impl_.implementation_.might_have_pending_waits = false;
    }
    log_to_all_peers(this,"aborting");
    local_68._0_16_ = (undefined1  [16])errors::make_error_code(torrent_aborted);
    disconnect_all(this,(error_code *)local_68,bittorrent);
    on_remove_peers(this);
    pp_Var6 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
    ;
    if ((this->m_storage).m_disk_io == (disk_interface *)0x0) {
      iVar10 = (*pp_Var6[5])();
      if ((*(uint *)(CONCAT44(extraout_var_04,iVar10) + 0x68) & 8) != 0) {
        iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_68);
        alert_manager::emplace_alert<libtorrent::cache_flushed_alert,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var_05,iVar10),(torrent_handle *)local_68);
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_68._8_8_ !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2 = (_Atomic_word *)(local_68._8_8_ + 0xc);
            iVar10 = *p_Var2;
            *p_Var2 = *p_Var2 + -1;
            UNLOCK();
          }
          else {
            iVar10 = *(_Atomic_word *)(local_68._8_8_ + 0xc);
            *(int *)(local_68._8_8_ + 0xc) = iVar10 + -1;
          }
          if (iVar10 == 1) {
            (*(*(_func_int ***)local_68._8_8_)[3])();
          }
        }
      }
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)local_68);
      local_68._16_8_ = (this->m_userdata).m_type_ptr;
      peStack_50 = (element_type *)(this->m_userdata).m_client_ptr;
      alert_manager::
      emplace_alert<libtorrent::torrent_removed_alert,libtorrent::torrent_handle,libtorrent::info_hash_t_const&,libtorrent::client_data_t>
                ((alert_manager *)CONCAT44(extraout_var_06,iVar10),(torrent_handle *)local_68,
                 &this->m_info_hash,(client_data_t *)(local_68 + 0x10));
      if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_68._8_8_ !=
          (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2 = (_Atomic_word *)(local_68._8_8_ + 0xc);
          iVar10 = *p_Var2;
          *p_Var2 = *p_Var2 + -1;
          UNLOCK();
        }
        else {
          iVar10 = *(_Atomic_word *)(local_68._8_8_ + 0xc);
          *(int *)(local_68._8_8_ + 0xc) = iVar10 + -1;
        }
        if (iVar10 == 1) {
          (*(*(_func_int ***)local_68._8_8_)[3])();
        }
      }
    }
    else {
      iVar10 = (*pp_Var6[4])();
      uVar3 = (this->m_storage).m_idx.m_val;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_68,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
      uVar7 = local_68._0_8_;
      uVar9 = local_68._8_8_;
      local_68._0_16_ = ZEXT816(0);
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iStack_40 = 0;
      local_38 = (session_interface *)0x0;
      pppStack_30 = (pointer)0x0;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      auVar8 = local_68._0_16_;
      (local_48._M_pi)->_vptr__Sp_counted_base = (_func_int **)on_torrent_aborted;
      (local_48._M_pi)->_M_use_count = 0;
      (local_48._M_pi)->_M_weak_count = 0;
      local_48._M_pi[1]._vptr__Sp_counted_base = (_func_int **)uVar7;
      local_68._8_4_ = (undefined4)uVar9;
      local_68._12_4_ = SUB84(uVar9,4);
      local_48._M_pi[1]._M_use_count = local_68._8_4_;
      local_48._M_pi[1]._M_weak_count = local_68._12_4_;
      pppStack_30 = (pointer)::std::
                             _Function_handler<void_(),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>))()>_>
                             ::_M_invoke;
      local_38 = (session_interface *)
                 ::std::
                 _Function_handler<void_(),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>))()>_>
                 ::_M_manager;
      local_68._0_16_ = auVar8;
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x48))
                ((long *)CONCAT44(extraout_var_01,iVar10),uVar3);
      if (local_38 != (session_interface *)0x0) {
        (*(code *)local_38)(&local_48,&local_48,3);
      }
      if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_68._8_8_ !=
          (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
    }
    if ((this->field_0x5db & 2) == 0) {
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x4b])();
      counters::inc_stats_counter((counters *)CONCAT44(extraout_var_02,iVar10),0xdb,-1);
      this->field_0x5db = this->field_0x5db | 2;
    }
    puVar1 = &(this->super_torrent_hot_members).field_0x4b;
    *puVar1 = *puVar1 & 0xf7;
    this->field_0x600 = this->field_0x600 & 0xfe;
    update_state_list(this);
    this_00 = &this->m_links;
    uVar11 = 0;
    do {
      if (-1 < *(int *)&this_00->super_array<libtorrent::aux::link,_8UL>) {
        psVar4 = (this->super_torrent_hot_members).m_ses;
        iVar10 = (*(psVar4->super_session_logger)._vptr_session_logger[0x3c])
                           (psVar4,uVar11 & 0xffffffff);
        link::unlink<libtorrent::aux::torrent>
                  ((link *)this_00,
                   (vector<libtorrent::aux::torrent_*> *)CONCAT44(extraout_var_03,iVar10),
                   (torrent_list_index_t)(int)uVar11);
      }
      uVar11 = uVar11 + 1;
      this_00 = (array<link,_aux::session_interface::num_torrent_lists,_torrent_list_index_t> *)
                &(this_00->super_array<libtorrent::aux::link,_8UL>).field_0x4;
    } while (uVar11 != 8);
    puVar1 = &(this->super_torrent_hot_members).field_0x4c;
    *puVar1 = *puVar1 & 0xfe;
  }
  return;
}

Assistant:

void torrent::abort()
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;

		m_abort = true;
		update_want_peers();
		update_want_tick();
		update_want_scrape();
		update_gauge();
		stop_announcing();

		// remove from download queue
		m_ses.set_queue_position(this, queue_position_t{-1});

		if (m_peer_class > peer_class_t{0})
		{
			remove_class(m_ses.peer_classes(), m_peer_class);
			m_ses.peer_classes().decref(m_peer_class);
			m_peer_class = peer_class_t{0};
		}

		m_inactivity_timer.cancel();

#ifndef TORRENT_DISABLE_LOGGING
		log_to_all_peers("aborting");
#endif

		// disconnect all peers and close all
		// files belonging to the torrents
		disconnect_all(errors::torrent_aborted, operation_t::bittorrent);

		// make sure to destruct the peers immediately
		on_remove_peers();
		TORRENT_ASSERT(m_connections.empty());

		// post a message to the main thread to destruct
		// the torrent object from there
		if (m_storage)
		{
			try {
				m_ses.disk_thread().async_stop_torrent(m_storage
					, std::bind(&torrent::on_torrent_aborted, shared_from_this()));
			}
			catch (std::exception const& e)
			{
				TORRENT_UNUSED(e);
				m_storage.reset();
#ifndef TORRENT_DISABLE_LOGGING
				debug_log("Failed to flush disk cache: %s", e.what());
#endif
				// clients may rely on this alert to be posted, so it's probably a
				// good idea to post it here, even though we failed
				// TODO: 3 should this alert have an error code in it?
				if (alerts().should_post<cache_flushed_alert>())
					alerts().emplace_alert<cache_flushed_alert>(get_handle());
			}
			m_ses.deferred_submit_jobs();
		}
		else
		{
			if (alerts().should_post<cache_flushed_alert>())
				alerts().emplace_alert<cache_flushed_alert>(get_handle());
			alerts().emplace_alert<torrent_removed_alert>(get_handle()
				, info_hash(), get_userdata());
		}

		// TODO: 2 abort lookups this torrent has made via the
		// session host resolver interface

		if (!m_apply_ip_filter)
		{
			inc_stats_counter(counters::non_filter_torrents, -1);
			m_apply_ip_filter = true;
		}

		m_paused = false;
		m_auto_managed = false;
		update_state_list();
		for (torrent_list_index_t i{}; i != m_links.end_index(); ++i)
		{
			if (!m_links[i].in_list()) continue;
			m_links[i].unlink(m_ses.torrent_list(i), i);
		}
		// don't re-add this torrent to the state-update list
		m_state_subscription = false;

#if TORRENT_USE_RTC
		if(m_rtc_signaling)
			m_rtc_signaling->close();
#endif
	}